

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O1

PaError PaUnixMutex_Unlock(PaUnixMutex *self)

{
  PaError PVar1;
  
  paUtilErr_ = pthread_mutex_unlock((pthread_mutex_t *)self);
  PVar1 = 0;
  if (paUtilErr_ != 0) {
    PaUnixMutex_Unlock_cold_1();
    PVar1 = -9999;
  }
  return PVar1;
}

Assistant:

PaError PaUnixMutex_Unlock( PaUnixMutex* self )
{
    PaError result = paNoError;

    PA_ENSURE_SYSTEM( pthread_mutex_unlock( &self->mtx ), 0 );
#ifdef PTHREAD_CANCEL
	int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, &oldState ), 0 );
#endif

error:
    return result;
}